

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_lexer *lexer;
  xpath_parse_result *pxVar1;
  ulong uVar2;
  xpath_ast_node *right;
  char *pcVar3;
  ast_type_t type;
  binary_op_t bVar4;
  binary_op_t bVar5;
  xpath_ast_node *local_38;
  
  lexer = &this->_lexer;
  local_38 = lhs;
  while( true ) {
    bVar4 = binary_op_t::parse(lexer);
    type = bVar4.asttype;
    if (type == ast_unknown) {
      return local_38;
    }
    if (bVar4.precedence < limit) {
      return local_38;
    }
    xpath_lexer::next(lexer);
    uVar2 = this->_depth + 1;
    this->_depth = uVar2;
    if (0x400 < uVar2) break;
    right = parse_path_or_unary_expression(this);
    while( true ) {
      if (right == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar5 = binary_op_t::parse(lexer);
      if ((bVar5.asttype == ast_unknown) || (bVar5.precedence <= bVar4.precedence)) break;
      right = parse_expression_rec(this,right,bVar5.precedence);
    }
    if ((type == ast_op_union) && ((local_38->_rettype != '\x01' || (right->_rettype != '\x01')))) {
      pcVar3 = "Union operator has to be applied to node sets";
      goto LAB_0012bddf;
    }
    local_38 = alloc_node(this,type,bVar4.rettype,local_38,right);
    if (local_38 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
  }
  pcVar3 = "Exceeded maximum allowed query depth";
LAB_0012bddf:
  pxVar1 = this->_result;
  pxVar1->error = pcVar3;
  pxVar1->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return NULL;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return NULL;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return NULL;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}